

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_>::~Array
          (Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_> *this)

{
  Maybe<capnp::Orphan<capnp::compiler::Expression>_> *pMVar1;
  size_t sVar2;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Maybe<capnp::Orphan<capnp::compiler::Expression>_> *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pMVar1,0x28,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Maybe<capnp::Orphan<capnp::compiler::Expression>_>_>::
               destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }